

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pre-process.c
# Opt level: O3

int do_handle_define(dmr_C *C,stream *stream,token **line,token *token,int attr)

{
  allocator *A;
  position *ppVar1;
  position ident;
  uint *puVar2;
  ulong *puVar3;
  uint uVar4;
  int iVar5;
  position pVar6;
  position pVar7;
  symbol *sym;
  uint uVar8;
  e_token_type type;
  char *pcVar9;
  token *list2;
  token *list2_00;
  position pVar10;
  position *p;
  int iVar11;
  position arglist_00;
  position pVar12;
  position local_50;
  position local_48;
  dmr_C *local_40;
  position local_38;
  token *arglist;
  
  ppVar1 = (position *)stream->name;
  if (((ulong)*ppVar1 & 0x3f) != 2) {
    pVar7 = *(position *)stream;
    pcVar9 = "expected identifier to \'define\'";
    C = C;
    goto LAB_0011f9ae;
  }
  uVar4 = (uint)line;
  arglist_00 = ppVar1[1];
  ident = ppVar1[2];
  pVar7 = *(position *)arglist_00;
  pVar10 = arglist_00;
  if ((pVar7._0_4_ >> 0x15 & 1) == 0) {
    if (((pVar7._0_4_ & 0x3f) != 0x11) || (*(uint *)((long)arglist_00 + 0x10) != 0x28)) {
      pVar10 = (position)&dmrC_eof_token_entry_;
      if (arglist_00 != (position)&dmrC_eof_token_entry_) {
        dmrC_warning(C,pVar7,"no whitespace before object-like macro body");
        pVar10 = arglist_00;
      }
      goto LAB_0011fa78;
    }
    pVar6 = *(position *)((long)arglist_00 + 8);
    pVar10 = (position)((ulong)pVar7 & 0xffffffffffdfffc0 | 0x1a);
    *(position *)arglist_00 = pVar10;
    *(uint *)((long)arglist_00 + 0x10) = 0;
    pVar7 = *(position *)pVar6;
    if (((pVar7._0_4_ & 0x3f) != 0x11) || (*(int *)((long)pVar6 + 0x10) != 0x29)) {
      while (uVar8 = pVar7._0_4_ & 0x3f, uVar8 == 2) {
        if (*(ident **)((long)pVar6 + 0x10) == C->S->__VA_ARGS___ident) {
          pcVar9 = "__VA_ARGS__ can only appear in the expansion of a C99 variadic macro";
          goto LAB_0011f9ae;
        }
        uVar8 = *(uint *)((long)arglist_00 + 0x10) + 1 & 0x3ff;
        *(uint *)((long)arglist_00 + 0x10) = *(uint *)((long)arglist_00 + 0x10) & 0xfffffc00 | uVar8
        ;
        if (uVar8 == 0) goto LAB_0011ffa5;
        pVar12 = *(position *)((long)pVar6 + 8);
        pVar10 = *(position *)pVar12;
        if ((pVar10._0_4_ & 0x3f) != 0x11) {
LAB_0011ff5d:
          if (pVar12 != (position)&dmrC_eof_token_entry_) goto LAB_0011ff7e;
          pVar10 = *(position *)pVar6;
          goto LAB_00120038;
        }
        iVar11 = *(int *)((long)pVar12 + 0x10);
        if (iVar11 != 0x2c) {
          if (iVar11 == 0x29) {
            *(ulong *)pVar12 = (ulong)pVar10 & 0xffffffffffffffc0 | 0x1a;
            *(undefined4 *)((long)pVar12 + 0x10) = 0;
            pVar10 = *(position *)((long)pVar12 + 8);
            *(token **)(*(long *)((long)pVar6 + 8) + 8) = &dmrC_eof_token_entry_;
            goto LAB_0011ffec;
          }
          if (iVar11 != 0x117) goto LAB_0011ff5d;
          puVar2 = *(uint **)((long)pVar12 + 8);
          if (((*puVar2 & 0x3f) != 0x11) || (puVar2[4] != 0x29)) goto LAB_00120038;
          *(ulong *)pVar12 = (ulong)pVar10 & 0xffffffffffffffc0 | 0x1a;
          *(undefined4 *)((long)pVar12 + 0x10) = 0x40000000;
          *(token **)(*(long *)((long)pVar6 + 8) + 8) = &dmrC_eof_token_entry_;
          pVar10 = *(position *)(puVar2 + 2);
          goto LAB_0011ffec;
        }
        pVar10 = (position)((ulong)pVar10 & 0xffffffffffffffc0 | 0x1a);
        *(position *)pVar12 = pVar10;
        *(undefined4 *)((long)pVar12 + 0x10) = 0;
        pVar6 = *(position *)((long)pVar12 + 8);
        pVar7 = *(position *)pVar6;
      }
      pVar12 = pVar6;
      if (uVar8 == 0x11) {
        if (*(int *)((long)pVar6 + 0x10) == 0x117) {
          puVar3 = *(ulong **)((long)pVar6 + 8);
          pVar10 = (position)((ulong)pVar7 & 0xffffffffffffffc0 | 2);
          *(position *)pVar6 = pVar10;
          *(ident **)((long)pVar6 + 0x10) = C->S->__VA_ARGS___ident;
          if (((*puVar3 & 0x3f) == 0x11) && ((uint)puVar3[2] == 0x29)) {
            uVar8 = *(uint *)((long)arglist_00 + 0x10) + 1 & 0x3ff;
            *(uint *)((long)arglist_00 + 0x10) =
                 *(uint *)((long)arglist_00 + 0x10) & 0xfffffc00 | uVar8;
            if (uVar8 == 0) {
LAB_0011ffa5:
              pVar7 = *(position *)pVar6;
              pcVar9 = "too many arguments in macro definition";
              C = C;
              goto LAB_0011f9ae;
            }
            pVar10 = *(position *)(puVar3 + 1);
            *puVar3 = *puVar3 & 0xffffffffffffffc0 | 0x1a;
            *(uint *)(puVar3 + 2) = (uint)puVar3[2] & 0x80000000 | 0x40000000;
            *(token **)(*(long *)((long)pVar6 + 8) + 8) = &dmrC_eof_token_entry_;
            goto LAB_0011ffec;
          }
        }
        else if (pVar6 != (position)&dmrC_eof_token_entry_) {
          if (*(int *)((long)pVar6 + 0x10) != 0x2c) goto LAB_0011ff7e;
          pcVar9 = "parameter name missing";
          goto LAB_0011f9ae;
        }
      }
      else if (pVar6 != (position)&dmrC_eof_token_entry_) {
LAB_0011ff7e:
        pcVar9 = dmrC_show_token(C,(token *)pVar12);
        dmrC_sparse_error(C,*(position *)pVar12,"\"%s\" may not appear in macro parameter list",
                          pcVar9);
        return 1;
      }
LAB_00120038:
      pcVar9 = "missing \')\' in macro parameter list";
      pVar7 = pVar10;
      C = C;
      goto LAB_0011f9ae;
    }
    pVar10 = *(position *)((long)pVar6 + 8);
    *(token **)((long)arglist_00 + 8) = &dmrC_eof_token_entry_;
LAB_0011ffec:
    if (pVar10 == (position)0x0) {
      return 1;
    }
  }
  else {
LAB_0011fa78:
    arglist_00 = (position)0x0;
  }
  local_50 = pVar10;
  if (((SUB84(*(position *)pVar10,0) & 0x3f) == 0x11) && (*(uint *)((long)pVar10 + 0x10) == 0x111))
  {
    pcVar9 = "\'##\' cannot appear at the ends of macro expansion";
    pVar7 = *(position *)pVar10;
    C = C;
LAB_0011f9ae:
    dmrC_sparse_error(C,pVar7,pcVar9);
    return 1;
  }
  if (pVar10 == (position)&dmrC_eof_token_entry_) {
    p = &local_50;
    pVar7 = (position)&dmrC_eof_token_entry_;
  }
  else {
    A = &C->token_allocator;
    p = &local_50;
    local_40 = C;
    do {
      pVar6 = pVar10;
      if ((((*(uint *)pVar10 & 0x3f) == 0x11) && (*(uint *)((long)pVar10 + 0x10) == 0x23)) &&
         (pVar6 = (position)handle_hash(local_40,(token **)p,(token *)arglist_00),
         pVar6 == (position)0x0)) {
        return 1;
      }
      uVar8 = **(uint **)((long)pVar6 + 8) & 0x3f;
      arglist = (token *)(ulong)uVar8;
      type = arglist_00._0_4_;
      if ((uVar8 == 0x11) && ((*(uint **)((long)pVar6 + 8))[4] == 0x111)) {
        uVar8 = 0;
        if ((*(uint *)pVar6 & 0x3f) == 0x11) {
          uVar8 = (uint)(*(int *)((long)pVar6 + 0x10) == 0x2c);
        }
        try_arg((dmr_C *)pVar6,(token *)0x16,type,arglist);
        pVar10 = *(position *)((long)pVar6 + 8);
        pVar7 = pVar6;
        local_38 = pVar6;
        do {
          local_48._0_4_ = uVar8;
          uVar8 = *(uint *)*(position *)((long)pVar10 + 8);
          pVar6 = *(position *)((long)pVar10 + 8);
          while (((uVar8 & 0x3f) == 0x11 && (*(uint *)((long)pVar6 + 0x10) == 0x111))) {
            *(position *)((long)pVar7 + 8) = pVar6;
            dmrC_allocator_free(A,(void *)pVar10);
            uVar8 = *(uint *)*(position *)((long)pVar6 + 8);
            pVar10 = pVar6;
            pVar6 = *(position *)((long)pVar6 + 8);
          }
          pVar7 = (position)(*(ulong *)pVar10 & 0xffffffffffffffc0 | 0x17);
          *(position *)pVar10 = pVar7;
          if (pVar6 == (position)&dmrC_eof_token_entry_) {
            pcVar9 = "\'##\' cannot appear at the ends of macro expansion";
            C = local_40;
            goto LAB_0011f9ae;
          }
          if ((((*(uint *)pVar6 & 0x3f) == 0x11) && (*(uint *)((long)pVar6 + 0x10) == 0x23)) &&
             (pVar6 = (position)
                      handle_hash(local_40,(token **)((long)pVar10 + 8),(token *)arglist_00),
             pVar6 == (position)0x0)) {
            return 1;
          }
          uVar8 = try_arg((dmr_C *)pVar6,(token *)0x16,type,arglist);
          if (((local_48._0_4_ != 1) || (uVar8 == 0)) &&
             (uVar8 = 0, local_38 = pVar6, (*(uint *)pVar6 & 0x3f) == 0x11)) {
            uVar8 = (uint)(*(int *)((long)pVar6 + 0x10) == 0x2c);
          }
          pVar10 = *(position *)((long)pVar6 + 8);
        } while (((*(uint *)pVar10 & 0x3f) == 0x11) &&
                (pVar7 = pVar6, *(uint *)((long)pVar10 + 0x10) == 0x111));
        if (uVar8 == 2) {
          *(ulong *)local_38 = *(ulong *)local_38 & 0xffffffffffffffc0 | 0x18;
        }
      }
      else {
        try_arg((dmr_C *)pVar6,(token *)0x14,type,arglist);
      }
      uVar8 = SUB84(*(position *)pVar6,0) & 0x3f;
      C = local_40;
      if (uVar8 - 0xf < 2) {
        **(uint **)((long)pVar6 + 0x10) = **(uint **)((long)pVar6 + 0x10) | 0x80000000;
      }
      else if (uVar8 == 1) {
        pcVar9 = "too many instances of argument in body";
        pVar7 = *(position *)pVar6;
        goto LAB_0011f9ae;
      }
      pVar10 = *(position *)((long)pVar6 + 8);
      p = (position *)((long)pVar6 + 8);
      pVar7 = local_50;
    } while (pVar10 != (position)&dmrC_eof_token_entry_);
  }
  pVar7 = (position)alloc_token(C,(position *)pVar7);
  *(ulong *)pVar7 = *(ulong *)pVar7 & 0xffffffffffffffc0 | 0x19;
  ((anon_union_8_7_c7bfca54_for_token_2 *)((long)pVar7 + 0x10))->ident = (ident *)ident;
  *(position *)((long)pVar7 + 8) = *p;
  *p = pVar7;
  pVar7 = local_50;
  iVar11 = 1;
  if (local_50 == (position)0x0) {
    return 1;
  }
  local_48 = arglist_00;
  sym = dmrC_lookup_symbol((ident *)ident,NS_UNDEF|NS_MACRO);
  if (sym == (symbol *)0x0) {
LAB_0011fdb1:
    sym = dmrC_alloc_symbol(C->S,*ppVar1,3);
    dmrC_bind_symbol(C->S,sym,(ident *)ident,NS_MACRO);
    ptrlist_add((ptr_list **)&C->macros,(void *)ident,&C->ptrlist_allocator);
  }
  else {
    uVar8 = *(uint *)sym >> 0x12 & 3;
    if ((int)uVar4 < (int)uVar8) {
      return 1;
    }
    local_38._0_1_ = (*(uint *)sym & 0x1ff00) == 0x100 && uVar8 == uVar4;
    iVar5 = token_list_different((dmr_C *)(sym->field_14).field_0.expansion,(token *)pVar7,list2);
    if ((iVar5 == 0) &&
       (iVar5 = token_list_different
                          ((dmr_C *)(sym->field_14).field_0.arglist,(token *)local_48,list2_00),
       iVar5 == 0)) {
      if (local_38._0_1_ != '\0') {
        return 1;
      }
      if (sym->scope == C->file_scope) goto LAB_0011fe13;
      goto LAB_0011fdb1;
    }
    if (((local_38._0_1_ & uVar4 == 1) != 0) || ((sym->field_14).field_0.used_in == C->file_scope))
    {
      dmrC_warning(C,*ppVar1,"preprocessor token %.*s redefined",
                   (ulong)*(uchar *)((long)ident + 0x10),(undefined1 *)((long)ident + 0x12));
      dmrC_info(C,sym->pos,"this was the original definition");
    }
    if (sym->scope != C->file_scope) goto LAB_0011fdb1;
  }
  (sym->field_14).field_0.expansion = (token *)pVar7;
  (sym->field_14).field_0.arglist = (token *)local_48;
  dmrC_allocator_free(&C->token_allocator,stream);
  iVar11 = 0;
LAB_0011fe13:
  (sym->field_14).field_0.used_in = (scope *)0x0;
  *(uint *)sym = (*(uint *)sym & 0xfff200ff) + (uVar4 & 3) * 0x40000 + 0x100;
  return iVar11;
}

Assistant:

static int do_handle_define(struct dmr_C *C, struct stream *stream, struct token **line, struct token *token, int attr)
{
	struct token *arglist, *expansion;
	struct token *left = token->next;
	struct symbol *sym;
	struct ident *name;
	int ret;

        (void) stream;
        (void) line;
        
	if (dmrC_token_type(left) != TOKEN_IDENT) {
		dmrC_sparse_error(C, token->pos, "expected identifier to 'define'");
		return 1;
	}

	name = left->ident;

	arglist = NULL;
	expansion = left->next;
	if (!expansion->pos.whitespace) {
		if (dmrC_match_op(expansion, '(')) {
			arglist = expansion;
			expansion = parse_arguments(C, expansion);
			if (!expansion)
				return 1;
		} else if (!dmrC_eof_token(expansion)) {
			dmrC_warning(C, expansion->pos,
				"no whitespace before object-like macro body");
		}
	}

	expansion = parse_expansion(C, expansion, arglist, name);
	if (!expansion)
		return 1;

	ret = 1;
	sym = dmrC_lookup_symbol(name, (enum namespace_type) (NS_MACRO | NS_UNDEF));
	if (sym) {
		int clean;

		if (attr < sym->attr)
			goto out;

		clean = (attr == sym->attr && sym->ns == NS_MACRO);

		if (token_list_different(C, sym->expansion, expansion) ||
		    token_list_different(C, sym->arglist, arglist)) {
			ret = 0;
			if ((clean && attr == SYM_ATTR_NORMAL)
					|| sym->used_in == C->file_scope) {
				dmrC_warning(C, left->pos, "preprocessor token %.*s redefined",
						name->len, name->name);
				dmrC_info(C, sym->pos, "this was the original definition");
			}
		} else if (clean)
			goto out;
	}

	if (!sym || sym->scope != C->file_scope) {
		sym = dmrC_alloc_symbol(C->S, left->pos, SYM_NODE);
		dmrC_bind_symbol(C->S, sym, name, NS_MACRO);
		dmrC_add_ident(C, &C->macros, name);
		ret = 0;
	}

	if (!ret) {
		sym->expansion = expansion;
		sym->arglist = arglist;
		dmrC_allocator_free(&C->token_allocator, token);	/* Free the "define" token, but not the rest of the line */
	}

	sym->ns = NS_MACRO;
	sym->used_in = NULL;
	sym->attr = attr;
out:
	return ret;
}